

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O2

bool uuids::uuid::is_valid_uuid<char[3]>(char (*in_str) [3])

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  
  bVar8 = detail::to_string_view<char>(*in_str);
  pcVar3 = bVar8._M_str;
  sVar2 = bVar8._M_len;
  if ((sVar2 == 0) || ((*pcVar3 == '{' && (pcVar3[sVar2 - 1] != '}')))) {
LAB_0015d657:
    bVar1 = false;
  }
  else {
    uVar7 = (ulong)(*pcVar3 == '{');
    uVar4 = sVar2 - uVar7;
    bVar5 = 1;
    uVar6 = 0;
    for (; uVar7 < uVar4; uVar7 = uVar7 + 1) {
      if (pcVar3[uVar7] != '-') {
        if (0xf < uVar6) goto LAB_0015d657;
        bVar1 = detail::is_hex<char>(pcVar3[uVar7]);
        if (!bVar1) goto LAB_0015d657;
        bVar5 = ~bVar5 & 1;
        uVar6 = uVar6 + bVar5;
      }
    }
    bVar1 = 0xf < uVar6;
  }
  return bVar1;
}

Assistant:

[[nodiscard]] constexpr static bool is_valid_uuid(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         if (str.empty())
            return false;

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return false;

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return false;
            }

            if (firstDigit)
            {
               firstDigit = false;
            }
            else
            {
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return false;
         }

         return true;
      }